

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O0

void __thiscall xscript::parser::ast_node::ast_node(ast_node *this,type_t t,ast_node *p)

{
  shared_ptr<xscript::parser::symbol_table> *psVar1;
  shared_ptr<xscript::parser::register_allocator> *psVar2;
  unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
  local_48;
  shared_ptr<xscript::parser::symbol_table> local_40 [2];
  ast_node *local_20;
  ast_node *p_local;
  ast_node *paStack_10;
  type_t t_local;
  ast_node *this_local;
  
  this->parent = p;
  local_20 = p;
  p_local._4_4_ = t;
  paStack_10 = this;
  std::
  vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ::vector(&this->children);
  this->type = p_local._4_4_;
  tokenizer::token::token(&this->token);
  std::shared_ptr<xscript::parser::symbol_table>::shared_ptr(&this->symbols);
  std::shared_ptr<xscript::parser::register_allocator>::shared_ptr(&this->regs);
  if (this->parent != (ast_node *)0x0) {
    if ((p_local._4_4_ == ROOT) || (p_local._4_4_ == BLOCK)) {
      std::make_shared<xscript::parser::symbol_table>();
      std::shared_ptr<xscript::parser::symbol_table>::operator=(&this->symbols,local_40);
      std::shared_ptr<xscript::parser::symbol_table>::~shared_ptr(local_40);
    }
    else {
      psVar1 = get_symbols(this->parent);
      std::shared_ptr<xscript::parser::symbol_table>::operator=(&this->symbols,psVar1);
    }
    if ((p_local._4_4_ == ROOT) || (p_local._4_4_ == FUNCTION_DECLARATION)) {
      std::make_unique<xscript::parser::register_allocator>();
      std::shared_ptr<xscript::parser::register_allocator>::operator=(&this->regs,&local_48);
      std::
      unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
      ::~unique_ptr(&local_48);
    }
    else {
      psVar2 = get_regs(this->parent);
      std::shared_ptr<xscript::parser::register_allocator>::operator=(&this->regs,psVar2);
    }
    return;
  }
  __assert_fail("parent != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/ast_node.cpp"
                ,0x13,"xscript::parser::ast_node::ast_node(type_t, ast_node *)");
}

Assistant:

ast_node::ast_node(type_t t, ast_node* p) :
    parent(p),
    type(t)
{
    assert(parent != nullptr);

    if (t == ROOT || t == BLOCK) {
        symbols = std::make_shared<symbol_table>();
    } else {
        symbols = parent->get_symbols();
    }

    if (t == ROOT || t == FUNCTION_DECLARATION) {
        regs = std::make_unique<register_allocator>();
    } else {
        regs = parent->get_regs();
    }

}